

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerNewScopeSlots(Lowerer *this,Instr *instr,bool doStackSlots)

{
  Func *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  uint uVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  uint32 uVar3;
  IntConstOpnd *this_02;
  Opnd *pOVar4;
  RegOpnd *newObjDst;
  RegOpnd *pRVar5;
  Lowerer *pLVar6;
  IndirOpnd *pIVar7;
  LabelInstr *this_03;
  Loop *pLVar8;
  Lowerer *this_04;
  uint uVar9;
  int32 offset;
  int iVar10;
  undefined1 local_88 [8];
  AutoReuseOpnd autoReuseUndefinedOpnd;
  AutoReuseOpnd autoReuseCurrOpnd;
  
  this_00 = this->m_func;
  sourceContextId = Func::GetSourceContextId(this_00);
  functionId = Func::GetLocalFunctionId(this_00);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,NewScopeSlotFastPathPhase,sourceContextId,functionId);
  if (bVar2) {
    LowerUnaryHelperMemWithFunctionInfo(this,instr,HelperOP_NewScopeSlots);
    return;
  }
  this_02 = IR::Opnd::AsIntConstOpnd(instr->m_src1);
  uVar3 = IR::IntConstOpnd::AsUint32(this_02);
  uVar9 = uVar3 - 2;
  pOVar4 = IR::Instr::UnlinkDst(instr);
  newObjDst = IR::Opnd::AsRegOpnd(pOVar4);
  if (!doStackSlots) {
    GenerateRecyclerAlloc(this,HelperAllocMemForVarArray,(ulong)(uVar3 << 3),newObjDst,instr,false);
  }
  pLVar6 = (Lowerer *)&this->m_lowererMD;
  uVar1 = 0xffff;
  if (uVar9 < 0xffff) {
    uVar1 = uVar9;
  }
  LowererMD::GenerateMemInit((LowererMD *)pLVar6,newObjDst,0,(ulong)uVar1,instr,!doStackSlots);
  pOVar4 = LoadFunctionInfoOpnd(pLVar6,instr);
  GenerateMemInit(this,newObjDst,8,pOVar4,instr,false);
  pRVar5 = (RegOpnd *)LoadLibraryValueOpnd(this,instr,ValueUndefined);
  pLVar6 = (Lowerer *)local_88;
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)pLVar6,(Opnd *)pRVar5,this_00,true);
  if (2 < uVar9) {
    pRVar5 = GetRegOpnd(pLVar6,(Opnd *)pRVar5,instr,this_00,TyVar);
    if (0x10 < uVar9) {
      pLVar6 = (Lowerer *)IR::RegOpnd::New(TyUint64,this_00);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&autoReuseUndefinedOpnd.autoDelete,(Opnd *)pLVar6,this->m_func,
                 true);
      pIVar7 = IR::IndirOpnd::New(newObjDst,(uVar9 & 0xfffffff8) * 8 + -0x30,TyUint64,this_00,false)
      ;
      InsertLea((RegOpnd *)pLVar6,&pIVar7->super_Opnd,instr);
      for (iVar10 = (uVar9 & 7) * 8 + 0x38; iVar10 != 0x38; iVar10 = iVar10 + -8) {
        GenerateMemInit(this,(RegOpnd *)pLVar6,iVar10,&pRVar5->super_Opnd,instr,false);
      }
      this_03 = InsertLoopTopLabel(this,instr);
      pLVar8 = IR::LabelInstr::GetLoop(this_03);
      for (offset = 0x38; offset != -8; offset = offset + -8) {
        GenerateMemInit(this,(RegOpnd *)pLVar6,offset,&pRVar5->super_Opnd,instr,false);
      }
      pIVar7 = IR::IndirOpnd::New((RegOpnd *)pLVar6,-0x40,TyUint64,this_00,false);
      this_04 = pLVar6;
      InsertLea((RegOpnd *)pLVar6,&pIVar7->super_Opnd,instr);
      InsertCompareBranch(this_04,&newObjDst->super_Opnd,(Opnd *)pLVar6,BrLt_A,true,this_03,instr,
                          false);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pLVar8->regAlloc).liveOnBackEdgeSyms,
                 *(BVIndex *)&((pLVar6->m_lowererMD).m_func)->m_threadContextInfo);
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pLVar8->regAlloc).liveOnBackEdgeSyms,(newObjDst->m_sym->super_Sym).m_id);
      this_01 = (pLVar8->regAlloc).liveOnBackEdgeSyms;
      pRVar5 = IR::Opnd::AsRegOpnd(&pRVar5->super_Opnd);
      BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pRVar5->m_sym->super_Sym).m_id);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseUndefinedOpnd.autoDelete);
      goto LAB_00545464;
    }
  }
  iVar10 = 0x10;
  while (bVar2 = uVar9 != 0, uVar9 = uVar9 - 1, bVar2) {
    GenerateMemInit(this,newObjDst,iVar10,&pRVar5->super_Opnd,instr,false);
    iVar10 = iVar10 + 8;
  }
LAB_00545464:
  if (!doStackSlots) {
    pRVar5 = IR::RegOpnd::New(instr->m_func->m_localClosureSym,TyUint64,this_00);
    InsertMove(&pRVar5->super_Opnd,&newObjDst->super_Opnd,instr,true);
  }
  IR::Instr::Remove(instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_88);
  return;
}

Assistant:

void
Lowerer::LowerNewScopeSlots(IR::Instr * instr, bool doStackSlots)
{
    Func * func = m_func;
    if (PHASE_OFF(Js::NewScopeSlotFastPathPhase, func))
    {
        this->LowerUnaryHelperMemWithFunctionInfo(instr, IR::HelperOP_NewScopeSlots);
        return;
    }

    uint const count = instr->GetSrc1()->AsIntConstOpnd()->AsUint32();
    uint const allocSize = count * sizeof(Js::Var);
    uint const actualSlotCount = count - Js::ScopeSlots::FirstSlotIndex;

    IR::RegOpnd * dst = instr->UnlinkDst()->AsRegOpnd();

    // dst = RecyclerAlloc(allocSize)
    // dst[EncodedSlotCountSlotIndex] = min(actualSlotCount, MaxEncodedSlotCount);
    // dst[ScopeMetadataSlotIndex] = FunctionBody;
    // mov undefinedOpnd, undefined
    // dst[FirstSlotIndex..count] = undefinedOpnd;

    // Note: stack allocation of both scope slots and frame display are done together
    // in lowering of NewStackFrameDisplay
    if (!doStackSlots)
    {
        GenerateRecyclerAlloc(IR::HelperAllocMemForVarArray, allocSize, dst, instr);
    }

    m_lowererMD.GenerateMemInit(dst, Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
            (size_t)min<uint>(actualSlotCount, Js::ScopeSlots::MaxEncodedSlotCount), instr, !doStackSlots);

    IR::Opnd * functionInfoOpnd = this->LoadFunctionInfoOpnd(instr);
    GenerateMemInit(dst, Js::ScopeSlots::ScopeMetadataSlotIndex * sizeof(Js::Var),
        functionInfoOpnd, instr, !doStackSlots);

    IR::Opnd * undefinedOpnd = this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined);
    const IR::AutoReuseOpnd autoReuseUndefinedOpnd(undefinedOpnd, func);

    // avoid using a register for the undefined pointer if we are going to assign 1 or 2

    if (actualSlotCount > 2)
    {
        undefinedOpnd = GetRegOpnd(undefinedOpnd, instr, func, TyVar);
    }

    int const loopUnrollCount = 8;

    if (actualSlotCount <= loopUnrollCount * 2)
    {
        // Just generate all the assignment in straight line code
        //  mov[dst + Js::FirstSlotIndex], undefinedOpnd
        // ...
        //  mov[dst + count - 1], undefinedOpnd
        for (unsigned int i = Js::ScopeSlots::FirstSlotIndex; i < count; i++)
        {
            GenerateMemInit(dst, sizeof(Js::Var) * i, undefinedOpnd, instr, !doStackSlots);
        }
    }
    else
    {
        // Just generate all the assignment in loop of loopUnrollCount and the rest as straight line code
        //
        //      lea currOpnd, [dst + sizeof(Var) * (loopAssignCount + Js::ScopeSlots::FirstSlotIndex - loopUnrollCount)];
        //      mov [currOpnd + loopUnrollCount + leftOverAssignCount - 1] , undefinedOpnd
        //      mov [currOpnd + loopUnrollCount + leftOverAssignCount - 2] , undefinedOpnd
        //      ...
        //      mov [currOpnd + loopUnrollCount], undefinedOpnd
        // $LoopTop:
        //      mov [currOpnd + loopUnrollCount - 1], undefinedOpnd
        //      mov [currOpnd + loopUnrollCount - 2], undefinedOpnd
        //      ...
        //      mov [currOpnd], undefinedOpnd
        //      lea currOpnd, [currOpnd - loopUnrollCount]
        //      cmp dst, currOpnd
        //      jlt $Looptop

        uint nLoop = actualSlotCount / loopUnrollCount;
        uint loopAssignCount = nLoop * loopUnrollCount;
        uint leftOverAssignCount = actualSlotCount - loopAssignCount;        // The left over assignments

        IR::RegOpnd * currOpnd = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseCurrOpnd(currOpnd, m_func);
        InsertLea(
            currOpnd,
            IR::IndirOpnd::New(
                dst,
                sizeof(Js::Var) * (loopAssignCount + Js::ScopeSlots::FirstSlotIndex - loopUnrollCount),
                TyMachPtr,
                func),
            instr);

        for (unsigned int i = 0; i < leftOverAssignCount; i++)
        {
            GenerateMemInit(currOpnd, sizeof(Js::Var) * (loopUnrollCount + leftOverAssignCount - i - 1), undefinedOpnd, instr, !doStackSlots);
        }

        IR::LabelInstr * loopTop = InsertLoopTopLabel(instr);
        Loop * loop = loopTop->GetLoop();

        for (unsigned int i = 0; i < loopUnrollCount; i++)
        {
            GenerateMemInit(currOpnd, sizeof(Js::Var) * (loopUnrollCount - i - 1), undefinedOpnd, instr, !doStackSlots);
        }
        InsertLea(currOpnd, IR::IndirOpnd::New(currOpnd, -((int)sizeof(Js::Var) * loopUnrollCount), TyMachPtr, func), instr);

        InsertCompareBranch(dst, currOpnd, Js::OpCode::BrLt_A, true, loopTop, instr);

        loop->regAlloc.liveOnBackEdgeSyms->Set(currOpnd->m_sym->m_id);
        loop->regAlloc.liveOnBackEdgeSyms->Set(dst->m_sym->m_id);
        loop->regAlloc.liveOnBackEdgeSyms->Set(undefinedOpnd->AsRegOpnd()->m_sym->m_id);
    }

    if (!doStackSlots)
    {
        InsertMove(IR::RegOpnd::New(instr->m_func->GetLocalClosureSym(), TyMachPtr, func), dst, instr);
    }
    instr->Remove();
}